

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long mkvparser::UnserializeInt(IMkvReader *pReader,longlong pos,longlong size,longlong *result_ref)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uchar b;
  char first_byte;
  byte local_4a;
  char local_49;
  ulong *local_48;
  long local_40;
  long local_38;
  
  lVar5 = -2;
  if (0xfffffffffffffff7 < size - 9U && (-1 < pos && pReader != (IMkvReader *)0x0)) {
    local_49 = '\0';
    iVar2 = (**pReader->_vptr_IMkvReader)(pReader,pos,1);
    if (iVar2 < 0) {
      lVar5 = (long)iVar2;
    }
    else {
      uVar4 = (ulong)local_49;
      bVar1 = 1 < size;
      local_48 = (ulong *)result_ref;
      if (1 < size) {
        lVar6 = pos + 1;
        local_38 = 1 - size;
        lVar5 = 2;
        do {
          iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar6,1,&local_4a);
          if (iVar2 < 0) {
            local_40 = (long)iVar2;
            break;
          }
          uVar4 = uVar4 << 8 | (ulong)local_4a;
          lVar6 = lVar6 + 1;
          bVar1 = lVar5 < size;
          lVar3 = local_38 + lVar5;
          lVar5 = lVar5 + 1;
        } while (lVar3 != 1);
      }
      lVar5 = local_40;
      if (!bVar1) {
        *local_48 = uVar4;
        lVar5 = 0;
      }
    }
  }
  return lVar5;
}

Assistant:

long UnserializeInt(IMkvReader* pReader, long long pos, long long size,
                    long long& result_ref) {
  if (!pReader || pos < 0 || size < 1 || size > 8)
    return E_FILE_FORMAT_INVALID;

  signed char first_byte = 0;
  const long status = pReader->Read(pos, 1, (unsigned char*)&first_byte);

  if (status < 0)
    return status;

  unsigned long long result = static_cast<unsigned long long>(first_byte);
  ++pos;

  for (long i = 1; i < size; ++i) {
    unsigned char b;

    const long status = pReader->Read(pos, 1, &b);

    if (status < 0)
      return status;

    result <<= 8;
    result |= b;

    ++pos;
  }

  result_ref = static_cast<long long>(result);
  return 0;
}